

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O0

void __thiscall String::trim(String *this,int n)

{
  int iVar1;
  string *psVar2;
  String local_68;
  String local_38;
  int local_14;
  String *pSStack_10;
  int n_local;
  String *this_local;
  
  local_14 = n;
  pSStack_10 = this;
  if (n < 1) {
    mid(&local_68,this,(long)n,-1);
    psVar2 = stdString_abi_cxx11_(&local_68);
    std::__cxx11::string::operator=((string *)this,(string *)psVar2);
    ~String(&local_68);
  }
  else {
    iVar1 = length(this);
    mid(&local_38,this,0,(long)(iVar1 - local_14));
    psVar2 = stdString_abi_cxx11_(&local_38);
    std::__cxx11::string::operator=((string *)this,(string *)psVar2);
    ~String(&local_38);
  }
  return;
}

Assistant:

void String::trim (int n)
{
	if (n > 0)
		_string = mid (0, length() - n).stdString();
	else
		_string = mid (n, -1).stdString();
}